

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O2

void bufchain_consume(bufchain *ch,size_t len)

{
  bufchain_granule *b;
  bufchain_granule *pbVar1;
  uint __line;
  ulong uVar2;
  long lVar3;
  char *__assertion;
  long lVar4;
  
  uVar2 = ch->buffersize;
  if (uVar2 < len) {
    __assertion = "ch->buffersize >= len";
    __line = 0x68;
  }
  else {
    while( true ) {
      if (len == 0) {
        return;
      }
      b = ch->head;
      if (b == (bufchain_granule *)0x0) break;
      lVar3 = (long)(int)len;
      lVar4 = (long)b->bufend - (long)b->bufpos;
      if (lVar3 < lVar4) {
        b->bufpos = b->bufpos + lVar3;
      }
      else {
        pbVar1 = b->next;
        ch->head = pbVar1;
        if (pbVar1 == (bufchain_granule *)0x0) {
          ch->tail = (bufchain_granule *)0x0;
        }
        smemclr(b,0x20);
        safefree(b);
        uVar2 = ch->buffersize;
        lVar3 = (long)(int)lVar4;
      }
      uVar2 = uVar2 - lVar3;
      ch->buffersize = uVar2;
      len = len - lVar3;
    }
    __assertion = "ch->head != NULL";
    __line = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                ,__line,"void bufchain_consume(bufchain *, size_t)");
}

Assistant:

void bufchain_consume(bufchain *ch, size_t len)
{
    struct bufchain_granule *tmp;

    assert(ch->buffersize >= len);
    while (len > 0) {
        int remlen = len;
        assert(ch->head != NULL);
        if (remlen >= ch->head->bufend - ch->head->bufpos) {
            remlen = ch->head->bufend - ch->head->bufpos;
            tmp = ch->head;
            ch->head = tmp->next;
            if (!ch->head)
                ch->tail = NULL;
            smemclr(tmp, sizeof(*tmp));
            sfree(tmp);
        } else
            ch->head->bufpos += remlen;
        ch->buffersize -= remlen;
        len -= remlen;
    }
}